

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_findi_Test<std::pair<char8_t,_char>_>::~UnicodeFullTest_findi_Test
          (UnicodeFullTest_findi_Test<std::pair<char8_t,_char>_> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, findi) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");

	// Empty substring
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"")), 0);

	// Single-characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(abcd_str)::npos);

	auto double_abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"AABBCCDD");

	// Single-characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(double_abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AA")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BB")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CC")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DD")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"aa")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bb")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cc")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"dd")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(double_abcd_str)::npos);
}